

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O1

raw_ostream * llvm::operator<<(raw_ostream *OS,HexNumber *Value)

{
  raw_ostream *this;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  StringRef Str;
  string local_40;
  
  Str.Length = 2;
  Str.Data = "0x";
  this = raw_ostream::operator<<(OS,Str);
  to_hexString_abi_cxx11_(&local_40,(llvm *)Value->Value,1,(bool)in_CL);
  raw_ostream::write(this,(int)local_40._M_dataplus._M_p,(void *)local_40._M_string_length,
                     CONCAT71(in_register_00000009,in_CL));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return OS;
}

Assistant:

raw_ostream &operator<<(raw_ostream &OS, const HexNumber &Value) {
  OS << "0x" << to_hexString(Value.Value);
  return OS;
}